

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void findConstInWhere(WhereConst *pConst,Expr *pExpr)

{
  Expr *pRight_00;
  Expr *p;
  int iVar1;
  CollSeq *pCVar2;
  Expr *pLeft;
  Expr *pRight;
  Expr *pExpr_local;
  WhereConst *pConst_local;
  
  if ((pExpr != (Expr *)0x0) && ((pExpr->flags & 1) == 0)) {
    if (pExpr->op == ',') {
      findConstInWhere(pConst,pExpr->pRight);
      findConstInWhere(pConst,pExpr->pLeft);
    }
    else if (pExpr->op == '5') {
      pRight_00 = pExpr->pRight;
      p = pExpr->pLeft;
      if (((pRight_00->op == 0xa2) && ((pRight_00->flags & 8) == 0)) &&
         (iVar1 = sqlite3ExprIsConstant(p), iVar1 != 0)) {
        pCVar2 = sqlite3BinaryCompareCollSeq(pConst->pParse,p,pRight_00);
        iVar1 = sqlite3IsBinary(pCVar2);
        if (iVar1 != 0) {
          constInsert(pConst,pRight_00,p);
          return;
        }
      }
      if (((p->op == 0xa2) && ((p->flags & 8) == 0)) &&
         (iVar1 = sqlite3ExprIsConstant(pRight_00), iVar1 != 0)) {
        pCVar2 = sqlite3BinaryCompareCollSeq(pConst->pParse,p,pRight_00);
        iVar1 = sqlite3IsBinary(pCVar2);
        if (iVar1 != 0) {
          constInsert(pConst,p,pRight_00);
        }
      }
    }
  }
  return;
}

Assistant:

static void findConstInWhere(WhereConst *pConst, Expr *pExpr){
  Expr *pRight, *pLeft;
  if( pExpr==0 ) return;
  if( ExprHasProperty(pExpr, EP_FromJoin) ) return;
  if( pExpr->op==TK_AND ){
    findConstInWhere(pConst, pExpr->pRight);
    findConstInWhere(pConst, pExpr->pLeft);
    return;
  }
  if( pExpr->op!=TK_EQ ) return;
  pRight = pExpr->pRight;
  pLeft = pExpr->pLeft;
  assert( pRight!=0 );
  assert( pLeft!=0 );
  if( pRight->op==TK_COLUMN
   && !ExprHasProperty(pRight, EP_FixedCol)
   && sqlite3ExprIsConstant(pLeft)
   && sqlite3IsBinary(sqlite3BinaryCompareCollSeq(pConst->pParse,pLeft,pRight))
  ){
    constInsert(pConst, pRight, pLeft);
  }else
  if( pLeft->op==TK_COLUMN
   && !ExprHasProperty(pLeft, EP_FixedCol)
   && sqlite3ExprIsConstant(pRight)
   && sqlite3IsBinary(sqlite3BinaryCompareCollSeq(pConst->pParse,pLeft,pRight))
  ){
    constInsert(pConst, pLeft, pRight);
  }
}